

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_frozen_serialize(roaring_bitmap_t *rb,char *buf)

{
  uint8_t uVar1;
  bitset_container_t *bitset;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char *__dest;
  char *res_1;
  long lVar8;
  char *__dest_00;
  char *res_2;
  long lVar9;
  char *__dest_01;
  long lVar10;
  array_container_t *ac;
  char *local_50;
  
  iVar2 = (rb->high_low_container).size;
  lVar10 = (long)iVar2;
  lVar6 = lVar10;
  if (lVar10 < 1) {
    uVar5 = lVar10 * 2;
    local_50 = buf + lVar10 * 2;
    __dest = buf;
  }
  else {
    lVar4 = 0;
    lVar8 = 0;
    lVar9 = 0;
    lVar7 = 0;
    do {
      uVar1 = (rb->high_low_container).typecodes[lVar4];
      if (uVar1 == '\x03') {
        lVar9 = lVar9 + (long)*(rb->high_low_container).containers[lVar4] * 4;
      }
      else if (uVar1 == '\x02') {
        lVar7 = lVar7 + (long)*(rb->high_low_container).containers[lVar4] * 2;
      }
      else {
        lVar8 = lVar8 + 0x2000;
      }
      lVar4 = lVar4 + 1;
    } while (lVar10 != lVar4);
    __dest_00 = buf + lVar8;
    __dest_01 = __dest_00 + lVar9;
    __dest = __dest_01 + lVar7;
    uVar5 = (ulong)(uint)(iVar2 * 2);
    local_50 = __dest + uVar5;
    if (0 < iVar2) {
      lVar7 = 0;
      do {
        uVar1 = (rb->high_low_container).typecodes[lVar7];
        bitset = (bitset_container_t *)(rb->high_low_container).containers[lVar7];
        if (uVar1 == '\x03') {
          memcpy(__dest_00,bitset->words,(long)bitset->cardinality << 2);
          uVar3 = (ulong)bitset->cardinality;
          __dest_00 = __dest_00 + uVar3 * 4;
        }
        else {
          if (uVar1 == '\x02') {
            memcpy(__dest_01,bitset->words,(long)bitset->cardinality * 2);
            iVar2 = bitset->cardinality;
            __dest_01 = __dest_01 + (long)iVar2 * 2;
          }
          else {
            memcpy(buf,bitset->words,0x2000);
            iVar2 = bitset->cardinality;
            if (iVar2 == -1) {
              iVar2 = bitset_container_compute_cardinality(bitset);
            }
            buf = buf + 0x2000;
          }
          uVar3 = (ulong)(iVar2 - 1);
        }
        *(short *)(local_50 + lVar7 * 2) = (short)uVar3;
        lVar7 = lVar7 + 1;
        lVar6 = (long)(rb->high_low_container).size;
      } while (lVar7 < lVar6);
    }
  }
  memcpy(__dest,(rb->high_low_container).keys,lVar6 * 2);
  memcpy(local_50 + uVar5,(rb->high_low_container).typecodes,(long)(rb->high_low_container).size);
  *(uint *)(local_50 + uVar5 + lVar10) = (rb->high_low_container).size << 0xf | 0x35c6;
  return;
}

Assistant:

void roaring_bitmap_frozen_serialize(const roaring_bitmap_t *rb, char *buf) {
    /*
     * Note: we do not require user to supply a specifically aligned buffer.
     * Thus we have to use memcpy() everywhere.
     */

    const roaring_array_t *ra = &rb->high_low_container;

    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_zone_size +=
                    BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                run_zone_size += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                array_zone_size += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }

    uint64_t *bitset_zone = (uint64_t *)arena_alloc(&buf, bitset_zone_size);
    rle16_t *run_zone = (rle16_t *)arena_alloc(&buf, run_zone_size);
    uint16_t *array_zone = (uint16_t *)arena_alloc(&buf, array_zone_size);
    uint16_t *key_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint16_t *count_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint8_t *typecode_zone = (uint8_t *)arena_alloc(&buf, ra->size);
    uint32_t *header_zone = (uint32_t *)arena_alloc(&buf, 4);

    for (int32_t i = 0; i < ra->size; i++) {
        uint16_t count;
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                const bitset_container_t *bc =
                    const_CAST_bitset(ra->containers[i]);
                memcpy(bitset_zone, bc->words,
                       BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t));
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                if (bc->cardinality != BITSET_UNKNOWN_CARDINALITY) {
                    count = (uint16_t)(bc->cardinality - 1);
                } else {
                    count =
                        (uint16_t)(bitset_container_compute_cardinality(bc) -
                                   1);
                }
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                size_t num_bytes = rc->n_runs * sizeof(rle16_t);
                memcpy(run_zone, rc->runs, num_bytes);
                run_zone += rc->n_runs;
                count = (uint16_t)rc->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                size_t num_bytes = ac->cardinality * sizeof(uint16_t);
                memcpy(array_zone, ac->array, num_bytes);
                array_zone += ac->cardinality;
                count = (uint16_t)(ac->cardinality - 1);
                break;
            }
            default:
                roaring_unreachable;
        }
        memcpy(&count_zone[i], &count, 2);
    }
    memcpy(key_zone, ra->keys, ra->size * sizeof(uint16_t));
    memcpy(typecode_zone, ra->typecodes, ra->size * sizeof(uint8_t));
    uint32_t header = ((uint32_t)ra->size << 15) | FROZEN_COOKIE;
    memcpy(header_zone, &header, 4);
}